

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

string * __thiscall
pbrt::CameraSceneEntity::ToString_abi_cxx11_(string *__return_storage_ptr__,CameraSceneEntity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::CameraTransform_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ CameraSeneEntity name: %s parameters: %s loc: %s cameraTransform: %s medium: %s ]",
             (char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_SceneEntity).parameters,
             (ParameterDictionary *)&(this->super_SceneEntity).loc,(FileLoc *)&this->cameraTransform
             ,(CameraTransform *)&this->medium,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ CameraSeneEntity name: %s parameters: %s loc: %s "
                            "cameraTransform: %s medium: %s ]",
                            name, parameters, loc, cameraTransform, medium);
    }